

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

double __thiscall ON_SurfaceCurvature::MaximumRadius(ON_SurfaceCurvature *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = ON_DBL_QNAN;
  if ((ABS(this->k1) < 1.23432101234321e+308) && (ABS(this->k2) < 1.23432101234321e+308)) {
    iVar1 = ON_DBL::Sign(this->k1);
    iVar2 = ON_DBL::Sign(this->k2);
    dVar4 = 0.0;
    if ((0 < iVar2 * iVar1) &&
       ((dVar3 = ABS(this->k1), 1e-300 < dVar3 && (dVar5 = ABS(this->k2), 1e-300 < dVar5)))) {
      dVar4 = (double)(~-(ulong)(dVar3 <= dVar5) & (ulong)dVar5 |
                      -(ulong)(dVar3 <= dVar5) & (ulong)dVar3);
    }
    dVar4 = (double)(~-(ulong)(1e-300 < dVar4) & (ulong)1e+300 |
                    (ulong)(1.0 / dVar4) & -(ulong)(1e-300 < dVar4));
  }
  return dVar4;
}

Assistant:

double ON_SurfaceCurvature::MaximumRadius() const
{
  if (ON_IS_VALID(k1) && ON_IS_VALID(k2))
  {
    // k = minimum directional curvature
    double k;
    if (ON_DBL::Sign(k1)*ON_DBL::Sign(k2) <= 0 || fabs(k1) <= 1e-300 || fabs(k2) <= 1e-300)
    {
      // If principal curvatures have opposite signs,
      // there is a direction with zero directional curvature.
      k = 0.0;
    }
    else
    {
      // The minimum directional curvature is in a principal curvature direction.
      k = (fabs(k1) <= fabs(k2)) ? fabs(k1) : fabs(k2);
    }

    // 1/k = maximum radius of curvature
    return
      (k > (1.0 / ON_SurfaceCurvature::InfinteRadius))
      ? 1.0 / k 
      : ON_SurfaceCurvature::InfinteRadius; 
  }

  return ON_DBL_QNAN;
}